

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

int tcg_gen_code_riscv64(TCGContext_conflict11 *s,TranslationBlock *tb)

{
  _Bool _Var1;
  TCGOpcode op_00;
  char *pcVar2;
  TCGTemp *ts;
  TCGLabel *l;
  size_t sVar3;
  target_ulong a;
  size_t off;
  TCGOp *pTStack_30;
  TCGOpcode opc;
  TCGOp *op;
  int num_insns;
  int i;
  TranslationBlock *tb_local;
  TCGContext_conflict11 *s_local;
  
  pcVar2 = getenv("UNICORN_DEBUG");
  if (pcVar2 != (char *)0x0) {
    tcg_dump_ops_riscv64(s,false,"TCG before optimization:");
  }
  tcg_optimize_riscv64(s);
  reachable_code_pass(s);
  liveness_pass_1(s);
  if ((0 < s->nb_indirects) && (_Var1 = liveness_pass_2(s), _Var1)) {
    liveness_pass_1(s);
  }
  tcg_reg_alloc_start(s);
  s->code_buf = (tcg_insn_unit *)(tb->tc).ptr;
  s->code_ptr = (tcg_insn_unit *)(tb->tc).ptr;
  (s->ldst_labels).sqh_first = (TCGLabelQemuLdst *)0x0;
  (s->ldst_labels).sqh_last = &(s->ldst_labels).sqh_first;
  s->pool_labels = (TCGLabelPoolData *)0x0;
  pcVar2 = getenv("UNICORN_DEBUG");
  if (pcVar2 != (char *)0x0) {
    tcg_dump_ops_riscv64(s,false,"TCG before codegen:");
  }
  op._0_4_ = -1;
  pTStack_30 = (s->ops).tqh_first;
  do {
    if (pTStack_30 == (TCGOp *)0x0) {
      sVar3 = tcg_current_code_size(s);
      s->gen_insn_end_off[(int)op] = (uint16_t)sVar3;
      s_local._4_4_ = tcg_out_ldst_finalize(s);
      if ((-1 < s_local._4_4_) && (s_local._4_4_ = tcg_out_pool_finalize(s), -1 < s_local._4_4_)) {
        _Var1 = tcg_resolve_relocs(s);
        if (_Var1) {
          flush_icache_range_riscv64((uintptr_t)s->code_buf,(uintptr_t)s->code_ptr);
          sVar3 = tcg_current_code_size(s);
          s_local._4_4_ = (int)sVar3;
        }
        else {
          s_local._4_4_ = -2;
        }
      }
      return s_local._4_4_;
    }
    op_00 = (TCGOpcode)*(byte *)pTStack_30;
    if (op_00 == INDEX_op_discard) {
      ts = arg_temp(pTStack_30->args[0]);
      temp_dead(s,ts);
    }
    else if (op_00 == INDEX_op_set_label) {
      tcg_reg_alloc_bb_end(s,s->reserved_regs);
      l = arg_label(pTStack_30->args[0]);
      tcg_out_label(s,l,s->code_ptr);
    }
    else if (op_00 == INDEX_op_call) {
      tcg_reg_alloc_call(s,pTStack_30);
    }
    else if (op_00 == INDEX_op_mov_i32) {
LAB_0118a2f9:
      tcg_reg_alloc_mov(s,pTStack_30);
    }
    else {
      if (op_00 != INDEX_op_movi_i32) {
        if (op_00 == INDEX_op_mov_i64) goto LAB_0118a2f9;
        if (op_00 != INDEX_op_movi_i64) {
          if (op_00 == INDEX_op_insn_start) {
            if (-1 < (int)op) {
              sVar3 = tcg_current_code_size(s);
              s->gen_insn_end_off[(int)op] = (uint16_t)sVar3;
              if (s->gen_insn_end_off[(int)op] != sVar3) {
                __assert_fail("s->gen_insn_end_off[num_insns] == off",
                              "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
                              ,0xedf,"int tcg_gen_code_riscv64(TCGContext *, TranslationBlock *)");
              }
            }
            op._0_4_ = (int)op + 1;
            for (op._4_4_ = 0; op._4_4_ < 1; op._4_4_ = op._4_4_ + 1) {
              s->gen_insn_data[(long)(int)op + (long)op._4_4_][0] = pTStack_30->args[op._4_4_];
            }
          }
          else {
            if (op_00 == INDEX_op_mov_vec) goto LAB_0118a2f9;
            if (op_00 == INDEX_op_dupi_vec) goto LAB_0118a30b;
            if (op_00 == INDEX_op_dup_vec) {
              tcg_reg_alloc_dup(s,pTStack_30);
            }
            else {
              tcg_op_supported_riscv64(op_00);
              tcg_reg_alloc_op(s,pTStack_30);
            }
          }
          goto LAB_0118a477;
        }
      }
LAB_0118a30b:
      tcg_reg_alloc_movi(s,pTStack_30);
    }
LAB_0118a477:
    if (s->code_gen_highwater < s->code_ptr) {
      return -1;
    }
    sVar3 = tcg_current_code_size(s);
    if (0xffff < sVar3) {
      return -2;
    }
    pTStack_30 = (pTStack_30->link).tqe_next;
  } while( true );
}

Assistant:

int tcg_gen_code(TCGContext *s, TranslationBlock *tb)
{
    int i, num_insns;
    TCGOp *op;

#ifndef NDEBUG
    if (getenv("UNICORN_DEBUG")) {
        tcg_dump_ops(s, false, "TCG before optimization:");
    }
#endif

#ifdef CONFIG_DEBUG_TCG
    /* Ensure all labels referenced have been emitted.  */
    {
        TCGLabel *l;
        bool error = false;

        QSIMPLEQ_FOREACH(l, &s->labels, next) {
            if (unlikely(!l->present) && l->refs) {
                error = true;
            }
        }
        assert(!error);
    }
#endif

#ifdef USE_TCG_OPTIMIZATIONS
    tcg_optimize(s);
#endif
    //tcg_dump_ops(s, false, "after opt1:");
    reachable_code_pass(s);
    //tcg_dump_ops(s, false, "after opt2:");
    liveness_pass_1(s);
    //tcg_dump_ops(s, false, "after opt3:");
    if (s->nb_indirects > 0) {
        /* Replace indirect temps with direct temps.  */
        if (liveness_pass_2(s)) {
            /* If changes were made, re-run liveness.  */
            liveness_pass_1(s);
        }
    }
    //tcg_dump_ops(s, false, "after opt4:");
    tcg_reg_alloc_start(s);

    s->code_buf = tb->tc.ptr;
    s->code_ptr = tb->tc.ptr;

#ifdef TCG_TARGET_NEED_LDST_LABELS
    QSIMPLEQ_INIT(&s->ldst_labels);
#endif
#ifdef TCG_TARGET_NEED_POOL_LABELS
    s->pool_labels = NULL;
#endif

#ifndef NDEBUG
    if (getenv("UNICORN_DEBUG")) {
        tcg_dump_ops(s, false, "TCG before codegen:");
    }
#endif
    num_insns = -1;
    QTAILQ_FOREACH(op, &s->ops, link) {
        TCGOpcode opc = op->opc;

        switch (opc) {
        case INDEX_op_mov_i32:
        case INDEX_op_mov_i64:
        case INDEX_op_mov_vec:
            tcg_reg_alloc_mov(s, op);
            break;
        case INDEX_op_movi_i32:
        case INDEX_op_movi_i64:
        case INDEX_op_dupi_vec:
            tcg_reg_alloc_movi(s, op);
            break;
        case INDEX_op_dup_vec:
            tcg_reg_alloc_dup(s, op);
            break;
        case INDEX_op_insn_start:
            if (num_insns >= 0) {
                size_t off = tcg_current_code_size(s);
                s->gen_insn_end_off[num_insns] = off;
                /* Assert that we do not overflow our stored offset.  */
                assert(s->gen_insn_end_off[num_insns] == off);
            }
            num_insns++;
            for (i = 0; i < TARGET_INSN_START_WORDS; ++i) {
                target_ulong a;
#if TARGET_LONG_BITS > TCG_TARGET_REG_BITS
                a = deposit64(op->args[i * 2], 32, 32, op->args[i * 2 + 1]);
#else
                a = op->args[i];
#endif
                s->gen_insn_data[num_insns][i] = a;
            }
            break;
        case INDEX_op_discard:
            temp_dead(s, arg_temp(op->args[0]));
            break;
        case INDEX_op_set_label:
            tcg_reg_alloc_bb_end(s, s->reserved_regs);
            tcg_out_label(s, arg_label(op->args[0]), s->code_ptr);
            break;
        case INDEX_op_call:
            tcg_reg_alloc_call(s, op);
            break;
        default:
            /* Sanity check that we've not introduced any unhandled opcodes. */
            tcg_debug_assert(tcg_op_supported(opc));
            /* Note: in order to speed up the code, it would be much
               faster to have specialized register allocator functions for
               some common argument patterns */
            tcg_reg_alloc_op(s, op);
            break;
        }
#ifdef CONFIG_DEBUG_TCG
        check_regs(s);
#endif

        /* Test for (pending) buffer overflow.  The assumption is that any
           one operation beginning below the high water mark cannot overrun
           the buffer completely.  Thus we can test for overflow after
           generating code without having to check during generation.  */
        if (unlikely((void *)s->code_ptr > s->code_gen_highwater)) {
            return -1;
        }
        /* Test for TB overflow, as seen by gen_insn_end_off.  */
        if (unlikely(tcg_current_code_size(s) > UINT16_MAX)) {
            return -2;
        }
    }
    tcg_debug_assert(num_insns >= 0);
    s->gen_insn_end_off[num_insns] = tcg_current_code_size(s);

    /* Generate TB finalization at the end of block */
#ifdef TCG_TARGET_NEED_LDST_LABELS
    i = tcg_out_ldst_finalize(s);
    if (i < 0) {
        return i;
    }
#endif
#ifdef TCG_TARGET_NEED_POOL_LABELS
    i = tcg_out_pool_finalize(s);
    if (i < 0) {
        return i;
    }
#endif
    if (!tcg_resolve_relocs(s)) {
        return -2;
    }

    /* flush instruction cache */
    flush_icache_range((uintptr_t)s->code_buf, (uintptr_t)s->code_ptr);

    return tcg_current_code_size(s);
}